

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int scriptsig_to_witness(uchar *bytes,size_t bytes_len,wally_tx_witness_stack **output)

{
  int iVar1;
  uchar *puVar2;
  size_t bytes_len_00;
  uchar *witness;
  wally_tx_witness_stack *result;
  size_t push_size;
  size_t push_opcode_size;
  
  result = (wally_tx_witness_stack *)0x0;
  iVar1 = -2;
  if ((((bytes_len != 0) && (bytes != (uchar *)0x0)) && (output != (wally_tx_witness_stack **)0x0))
     && (iVar1 = wally_tx_witness_stack_init_alloc(2,&result), iVar1 == 0)) {
    puVar2 = bytes + bytes_len;
    while (bytes < puVar2) {
      bytes_len_00 = (long)puVar2 - (long)bytes;
      iVar1 = script_get_push_size_from_bytes(bytes,bytes_len_00,&push_size);
      if ((iVar1 != 0) ||
         (iVar1 = script_get_push_opcode_size_from_bytes(bytes,bytes_len_00,&push_opcode_size),
         iVar1 != 0)) {
LAB_003ff374:
        wally_tx_witness_stack_free(result);
        return iVar1;
      }
      witness = bytes + push_opcode_size;
      iVar1 = wally_tx_witness_stack_add(result,witness,push_size);
      if (iVar1 != 0) goto LAB_003ff374;
      bytes = witness + push_size;
    }
    *output = result;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int scriptsig_to_witness(unsigned char *bytes, size_t bytes_len, struct wally_tx_witness_stack **output)
{
    unsigned char *p = bytes, *end = p + bytes_len;
    struct wally_tx_witness_stack *result = NULL;
    int ret = WALLY_OK;

    if (!bytes || !output || !bytes_len) {
        return WALLY_EINVAL;
    }

    if ((ret = wally_tx_witness_stack_init_alloc(2, &result)) != WALLY_OK) {
        return ret;
    }

    while (p < end) {
        size_t push_size, push_opcode_size;

        if ((ret = script_get_push_size_from_bytes(p, end - p, &push_size)) != WALLY_OK) {
            goto fail;
        }
        if ((ret = script_get_push_opcode_size_from_bytes(p, end - p, &push_opcode_size)) != WALLY_OK) {
            goto fail;
        }
        p += push_opcode_size;

        if ((ret = wally_tx_witness_stack_add(result, p, push_size)) != WALLY_OK) {
            goto fail;
        }
        p += push_size;
    }

    *output = result;
    return WALLY_OK;

fail:
    wally_tx_witness_stack_free(result);
    return ret;
}